

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void ClipperLib::CleanPolygon(Path *in_poly,Path *out_poly,double distance)

{
  undefined8 *puVar1;
  pointer pIVar2;
  int *piVar3;
  int *piVar4;
  undefined4 *puVar5;
  undefined1 auVar6 [16];
  double distSqrd;
  cInt cVar7;
  undefined8 uVar8;
  bool bVar9;
  int *piVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  pointer pIVar14;
  size_type __new_size;
  long lVar15;
  OutPt *result;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  
  pIVar14 = (in_poly->
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pIVar2 = (in_poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pIVar2 - (long)pIVar14;
  if (lVar16 == 0) {
    pIVar14 = (out_poly->
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((out_poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
        _M_impl.super__Vector_impl_data._M_finish != pIVar14) {
      (out_poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
      _M_impl.super__Vector_impl_data._M_finish = pIVar14;
    }
    return;
  }
  uVar17 = lVar16 >> 4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar17;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x28),8) == 0) {
    uVar11 = SUB168(auVar6 * ZEXT816(0x28),0);
  }
  piVar10 = (int *)operator_new__(uVar11);
  lVar16 = 0;
  do {
    puVar1 = (undefined8 *)((long)piVar10 + lVar16 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar16 = lVar16 + 0x28;
  } while (uVar17 * 0x28 != lVar16);
  if (pIVar2 != pIVar14) {
    uVar11 = 1;
    piVar12 = piVar10;
    do {
      cVar7 = pIVar14->Y;
      *(cInt *)(piVar12 + 2) = pIVar14->X;
      *(cInt *)(piVar12 + 4) = cVar7;
      uVar13 = 0;
      if (uVar17 != uVar11) {
        uVar13 = uVar11;
      }
      *(int **)(piVar12 + 6) = piVar10 + uVar13 * 10;
      *(int **)(piVar10 + uVar13 * 10 + 8) = piVar12;
      *piVar12 = 0;
      lVar16 = (-(ulong)(uVar17 == 0) - uVar17) + uVar11;
      uVar11 = uVar11 + 1;
      piVar12 = piVar12 + 10;
      pIVar14 = pIVar14 + 1;
    } while (lVar16 != 0);
  }
  piVar12 = piVar10;
  if (*piVar10 == 0) {
    distSqrd = distance * distance;
    do {
      piVar3 = *(int **)(piVar12 + 6);
      piVar4 = *(int **)(piVar12 + 8);
      if (piVar3 == piVar4) break;
      dVar18 = (double)*(long *)(piVar12 + 2) - (double)*(long *)(piVar4 + 2);
      dVar19 = (double)*(long *)(piVar12 + 4) - (double)*(long *)(piVar4 + 4);
      if (dVar18 * dVar18 + dVar19 * dVar19 <= distSqrd) {
        *(int **)(piVar4 + 6) = piVar3;
        *(int **)(*(long *)(piVar12 + 6) + 0x20) = piVar4;
        *piVar4 = 0;
        uVar17 = uVar17 - 1;
        piVar12 = piVar4;
      }
      else {
        dVar19 = (double)*(long *)(piVar4 + 2) - (double)*(long *)(piVar3 + 2);
        dVar18 = (double)*(long *)(piVar4 + 4) - (double)*(long *)(piVar3 + 4);
        if (dVar19 * dVar19 + dVar18 * dVar18 <= distSqrd) {
          puVar5 = *(undefined4 **)(piVar3 + 8);
          *(undefined8 *)(puVar5 + 6) = *(undefined8 *)(piVar3 + 6);
          *(undefined4 **)(*(long *)(piVar3 + 6) + 0x20) = puVar5;
          *puVar5 = 0;
          piVar3 = *(int **)(piVar12 + 8);
          *(undefined8 *)(piVar3 + 6) = *(undefined8 *)(piVar12 + 6);
          *(int **)(*(long *)(piVar12 + 6) + 0x20) = piVar3;
          *piVar3 = 0;
          uVar17 = uVar17 - 2;
          piVar12 = piVar3;
        }
        else {
          bVar9 = SlopesNearCollinear((IntPoint *)(piVar4 + 2),(IntPoint *)(piVar12 + 2),
                                      (IntPoint *)(piVar3 + 2),distSqrd);
          if (bVar9) {
            *(int **)(piVar4 + 6) = piVar3;
            *(int **)(*(long *)(piVar12 + 6) + 0x20) = piVar4;
            *piVar4 = 0;
            uVar17 = uVar17 - 1;
            piVar12 = piVar4;
          }
          else {
            *piVar12 = 1;
            piVar12 = piVar3;
          }
        }
      }
    } while (*piVar12 == 0);
  }
  __new_size = 0;
  if (2 < uVar17) {
    __new_size = uVar17;
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::resize
            (out_poly,__new_size);
  if (2 < uVar17) {
    lVar15 = __new_size + (__new_size == 0);
    lVar16 = 0;
    do {
      uVar8 = *(undefined8 *)(piVar12 + 4);
      puVar1 = (undefined8 *)
               ((long)&((out_poly->
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        )._M_impl.super__Vector_impl_data._M_start)->X + lVar16);
      *puVar1 = *(undefined8 *)(piVar12 + 2);
      puVar1[1] = uVar8;
      piVar12 = *(int **)(piVar12 + 6);
      lVar16 = lVar16 + 0x10;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  operator_delete__(piVar10);
  return;
}

Assistant:

void CleanPolygon(const Path& in_poly, Path& out_poly, double distance)
{
  //distance = proximity in units/pixels below which vertices
  //will be stripped. Default ~= sqrt(2).
  
  size_t size = in_poly.size();
  
  if (size == 0) 
  {
    out_poly.clear();
    return;
  }

  OutPt* outPts = new OutPt[size];
  for (size_t i = 0; i < size; ++i)
  {
    outPts[i].Pt = in_poly[i];
    outPts[i].Next = &outPts[(i + 1) % size];
    outPts[i].Next->Prev = &outPts[i];
    outPts[i].Idx = 0;
  }

  double distSqrd = distance * distance;
  OutPt* op = &outPts[0];
  while (op->Idx == 0 && op->Next != op->Prev) 
  {
    if (PointsAreClose(op->Pt, op->Prev->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    } 
    else if (PointsAreClose(op->Prev->Pt, op->Next->Pt, distSqrd))
    {
      ExcludeOp(op->Next);
      op = ExcludeOp(op);
      size -= 2;
    }
    else if (SlopesNearCollinear(op->Prev->Pt, op->Pt, op->Next->Pt, distSqrd))
    {
      op = ExcludeOp(op);
      size--;
    }
    else
    {
      op->Idx = 1;
      op = op->Next;
    }
  }

  if (size < 3) size = 0;
  out_poly.resize(size);
  for (size_t i = 0; i < size; ++i)
  {
    out_poly[i] = op->Pt;
    op = op->Next;
  }
  delete [] outPts;
}